

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O0

double __thiscall VVCStreamReader::getStreamFPS(VVCStreamReader *this,void *curNalUnit)

{
  double local_20;
  double fps;
  void *curNalUnit_local;
  VVCStreamReader *this_local;
  
  local_20 = 0.0;
  if (this->m_vps != (VvcVpsUnit *)0x0) {
    local_20 = VvcVpsUnit::getFPS(this->m_vps);
  }
  if (((local_20 == 0.0) && (!NAN(local_20))) && (this->m_sps != (VvcSpsUnit *)0x0)) {
    local_20 = VvcSpsUnit::getFPS(this->m_sps);
  }
  return local_20;
}

Assistant:

double VVCStreamReader::getStreamFPS(void* curNalUnit)
{
    double fps = 0;
    if (m_vps)
        fps = m_vps->getFPS();
    if (fps == 0.0 && m_sps)
        fps = m_sps->getFPS();
    return fps;
}